

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::MergeFrom
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  bool bVar1;
  LogMessage *other;
  Value *pVVar2;
  Value *pVVar3;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  DictionaryValue_KeyValuePair *local_18;
  DictionaryValue_KeyValuePair *from_local;
  DictionaryValue_KeyValuePair *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
               ,0x21ca);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = _internal_has_key(local_18);
  if (bVar1) {
    pVVar2 = _internal_mutable_key(this);
    pVVar3 = _internal_key(local_18);
    Value::MergeFrom(pVVar2,pVVar3);
  }
  bVar1 = _internal_has_value(local_18);
  if (bVar1) {
    pVVar2 = _internal_mutable_value(this);
    pVVar3 = _internal_value(local_18);
    Value::MergeFrom(pVVar2,pVVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DictionaryValue_KeyValuePair::MergeFrom(const DictionaryValue_KeyValuePair& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_key()) {
    _internal_mutable_key()->::CoreML::Specification::MILSpec::Value::MergeFrom(from._internal_key());
  }
  if (from._internal_has_value()) {
    _internal_mutable_value()->::CoreML::Specification::MILSpec::Value::MergeFrom(from._internal_value());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}